

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::HasCMP0054AlreadyBeenReported(cmMakefile *this)

{
  pair<std::_Rb_tree_iterator<cmListFileContext>,_bool> pVar1;
  cmListFileContext cStack_58;
  
  GetExecutionContext(&cStack_58,this);
  pVar1 = std::
          _Rb_tree<cmListFileContext,_cmListFileContext,_std::_Identity<cmListFileContext>,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>
          ::_M_insert_unique<cmListFileContext>(&(this->CMP0054ReportedIds)._M_t,&cStack_58);
  cmListFileContext::~cmListFileContext(&cStack_58);
  return (bool)(~pVar1.second & 1);
}

Assistant:

bool cmMakefile::HasCMP0054AlreadyBeenReported() const
{
  return !this->CMP0054ReportedIds.insert(this->GetExecutionContext()).second;
}